

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_frame_size_with_refs(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  RefCntBuffer *pRVar5;
  long in_RDI;
  RefCntBuffer *ref_frame_1;
  int i_2;
  RefCntBuffer *ref_frame;
  int i_1;
  int num_bits_height;
  int num_bits_width;
  SequenceHeader *seq_params;
  YV12_BUFFER_CONFIG *buf;
  RefCntBuffer *ref_buf;
  int i;
  int has_valid_ref_frame;
  int found;
  int height;
  int width;
  RefCntBuffer *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  aom_read_bit_buffer *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_24;
  uint uVar6;
  int iVar7;
  int local_18;
  int local_14;
  
  iVar7 = 0;
  uVar6 = 0;
  local_24 = 1;
  do {
    if (7 < local_24) {
LAB_001b727a:
      lVar1 = *(long *)(in_RDI + 0x6088);
      if (iVar7 == 0) {
        read_frame_size((aom_read_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        (int)in_stack_ffffffffffffffa8,
                        (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        &in_stack_ffffffffffffff98->ref_count);
        setup_superres((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,
                       (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       &in_stack_ffffffffffffff98->ref_count);
        resize_context_buffers
                  ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
        setup_render_size((AV1_COMMON *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (aom_read_bit_buffer *)in_stack_ffffffffffffff98);
      }
      if ((local_14 < 1) || (local_18 < 1)) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                           "Invalid frame size");
      }
      for (iVar2 = 1; iVar2 < 8; iVar2 = iVar2 + 1) {
        pRVar5 = get_ref_frame_buf((AV1_COMMON *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                   (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff98 >> 0x38));
        uVar3 = valid_ref_frame_size
                          ((pRVar5->buf).field_2.field_0.y_crop_width,
                           (pRVar5->buf).field_3.field_0.y_crop_height,local_14,local_18);
        uVar6 = uVar3 | uVar6;
      }
      if (uVar6 == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                           "Referenced frame has invalid size");
      }
      for (iVar2 = 1; iVar2 < 8; iVar2 = iVar2 + 1) {
        in_stack_ffffffffffffff98 =
             get_ref_frame_buf((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                               (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff98 >> 0x38));
        iVar4 = valid_ref_frame_img_fmt
                          ((in_stack_ffffffffffffff98->buf).bit_depth,
                           (in_stack_ffffffffffffff98->buf).subsampling_x,
                           (in_stack_ffffffffffffff98->buf).subsampling_y,
                           *(aom_bit_depth_t *)(lVar1 + 0x48),*(int *)(lVar1 + 0x60),
                           *(int *)(lVar1 + 100));
        if (iVar4 == 0) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                             "Referenced frame has incompatible color format");
        }
      }
      setup_buffer_pool((AV1_COMMON *)CONCAT44(iVar7,uVar6));
      return;
    }
    iVar2 = aom_rb_read_bit(in_stack_ffffffffffffffa8);
    if (iVar2 != 0) {
      pRVar5 = get_ref_frame_buf((AV1_COMMON *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff98 >> 0x38));
      if (pRVar5 != (RefCntBuffer *)0x0) {
        local_14 = (pRVar5->buf).field_2.field_0.y_crop_width;
        local_18 = (pRVar5->buf).field_3.field_0.y_crop_height;
        *(int *)(in_RDI + 0x40) = (pRVar5->buf).render_width;
        *(int *)(in_RDI + 0x44) = (pRVar5->buf).render_height;
        setup_superres((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,
                       (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       &in_stack_ffffffffffffff98->ref_count);
        resize_context_buffers
                  ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
        iVar7 = 1;
        goto LAB_001b727a;
      }
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                         "Invalid condition: invalid reference buffer");
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static inline void setup_frame_size_with_refs(AV1_COMMON *cm,
                                              struct aom_read_bit_buffer *rb) {
  int width, height;
  int found = 0;
  int has_valid_ref_frame = 0;
  for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    if (aom_rb_read_bit(rb)) {
      const RefCntBuffer *const ref_buf = get_ref_frame_buf(cm, i);
      // This will never be NULL in a normal stream, as streams are required to
      // have a shown keyframe before any inter frames, which would refresh all
      // the reference buffers. However, it might be null if we're starting in
      // the middle of a stream, and static analysis will error if we don't do
      // a null check here.
      if (ref_buf == NULL) {
        aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                           "Invalid condition: invalid reference buffer");
      } else {
        const YV12_BUFFER_CONFIG *const buf = &ref_buf->buf;
        width = buf->y_crop_width;
        height = buf->y_crop_height;
        cm->render_width = buf->render_width;
        cm->render_height = buf->render_height;
        setup_superres(cm, rb, &width, &height);
        resize_context_buffers(cm, width, height);
        found = 1;
        break;
      }
    }
  }

  const SequenceHeader *const seq_params = cm->seq_params;
  if (!found) {
    int num_bits_width = seq_params->num_bits_width;
    int num_bits_height = seq_params->num_bits_height;

    read_frame_size(rb, num_bits_width, num_bits_height, &width, &height);
    setup_superres(cm, rb, &width, &height);
    resize_context_buffers(cm, width, height);
    setup_render_size(cm, rb);
  }

  if (width <= 0 || height <= 0)
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Invalid frame size");

  // Check to make sure at least one of frames that this frame references
  // has valid dimensions.
  for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    const RefCntBuffer *const ref_frame = get_ref_frame_buf(cm, i);
    has_valid_ref_frame |=
        valid_ref_frame_size(ref_frame->buf.y_crop_width,
                             ref_frame->buf.y_crop_height, width, height);
  }
  if (!has_valid_ref_frame)
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Referenced frame has invalid size");
  for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    const RefCntBuffer *const ref_frame = get_ref_frame_buf(cm, i);
    if (!valid_ref_frame_img_fmt(
            ref_frame->buf.bit_depth, ref_frame->buf.subsampling_x,
            ref_frame->buf.subsampling_y, seq_params->bit_depth,
            seq_params->subsampling_x, seq_params->subsampling_y))
      aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                         "Referenced frame has incompatible color format");
  }
  setup_buffer_pool(cm);
}